

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::IntegerTypeSyntax::IntegerTypeSyntax
          (IntegerTypeSyntax *this,SyntaxKind kind,Token keyword,Token signing,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions)

{
  bool bVar1;
  reference ppVVar2;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_RDI;
  pointer in_R8;
  size_t in_R9;
  VariableDimensionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *__range2;
  VariableDimensionSyntax *in_stack_ffffffffffffffb0;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffb8;
  __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
  local_40;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *local_38;
  pointer local_20;
  size_t local_18;
  SyntaxNode *local_10;
  size_t local_8;
  
  local_20 = in_R8;
  local_18 = in_R9;
  local_10 = in_RDX;
  local_8 = in_RCX;
  DataTypeSyntax::DataTypeSyntax
            ((DataTypeSyntax *)in_stack_ffffffffffffffb0,(SyntaxKind)((ulong)in_RDI >> 0x20));
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = local_10;
  (in_RDI->super_SyntaxListBase).childCount = local_8;
  (in_RDI->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)._M_ptr =
       local_20;
  (in_RDI->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)._M_extent.
  _M_extent_value = local_18;
  SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_ffffffffffffffb0,in_RDI)
  ;
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)in_RDI;
  local_38 = in_RDI + 1;
  local_40._M_current =
       (VariableDimensionSyntax **)
       std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)in_RDI);
  std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_40);
    in_stack_ffffffffffffffb0 = *ppVVar2;
    (in_stack_ffffffffffffffb0->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

IntegerTypeSyntax(SyntaxKind kind, Token keyword, Token signing, const SyntaxList<VariableDimensionSyntax>& dimensions) :
        DataTypeSyntax(kind), keyword(keyword), signing(signing), dimensions(dimensions) {
        this->dimensions.parent = this;
        for (auto child : this->dimensions)
            child->parent = this;
    }